

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesGroupInfo.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XercesGroupInfo::XercesGroupInfo(XercesGroupInfo *this,MemoryManager *manager)

{
  int iVar1;
  XMLSize_t index;
  RefVectorOf<xercesc_4_0::SchemaElementDecl> *pRVar2;
  undefined4 extraout_var;
  long lVar3;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XercesGroupInfo_0040f370;
  this->fCheckElementConsistency = true;
  this->fScope = 0xfffffffe;
  this->fNameId = 0;
  this->fNamespaceId = 0;
  this->fContentSpec = (ContentSpecNode *)0x0;
  this->fElements = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0;
  this->fBaseGroup = (XercesGroupInfo *)0x0;
  this->fLocator = (XSDLocator *)0x0;
  pRVar2 = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)XMemory::operator_new(0x30,manager);
  (pRVar2->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__BaseRefVectorOf_00409870;
  (pRVar2->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fAdoptedElems = false;
  (pRVar2->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fCurCount = 0;
  (pRVar2->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fMaxCount = 4;
  (pRVar2->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList =
       (SchemaElementDecl **)0x0;
  (pRVar2->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fMemoryManager = manager;
  iVar1 = (*manager->_vptr_MemoryManager[3])(manager,0x20);
  (pRVar2->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList =
       (SchemaElementDecl **)CONCAT44(extraout_var,iVar1);
  lVar3 = 0;
  do {
    (pRVar2->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList[lVar3] =
         (SchemaElementDecl *)0x0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  (pRVar2->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>)._vptr_BaseRefVectorOf =
       (_func_int **)&PTR__RefVectorOf_004097f8;
  this->fElements = pRVar2;
  return;
}

Assistant:

XercesGroupInfo::XercesGroupInfo(MemoryManager* const manager)
    : fCheckElementConsistency(true)
    , fScope(Grammar::TOP_LEVEL_SCOPE)
    , fNameId(0)
    , fNamespaceId(0)
    , fContentSpec(0)
    , fElements(0)
    , fBaseGroup(0)
    , fLocator(0)
{
    fElements = new (manager) RefVectorOf<SchemaElementDecl>(4, false, manager);
}